

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::IEEEFloat::addOrSubtractSpecials(IEEEFloat *this,IEEEFloat *rhs,bool subtract)

{
  byte bVar1;
  byte bVar2;
  opStatus oVar3;
  opStatus oVar4;
  
  bVar1 = this->field_0x12;
  bVar2 = rhs->field_0x12;
  oVar3 = opOK;
  oVar4 = opOK;
  switch((bVar2 & 7) + (bVar1 * '\x04' & 0x1c)) {
  case 0:
    oVar4 = oVar3;
    if ((((bVar2 ^ bVar1) & 8) == 0) == subtract) {
      makeNaN(this,false,false,(APInt *)0x0);
      oVar4 = opInvalidOp;
    }
    break;
  case 1:
  case 9:
  case 0xd:
    this->field_0x12 = (bVar1 & 0xf0 | ((bVar2 & 8) >> 3 ^ subtract) << 3) + 1;
    copySignificand(this,rhs);
    oVar4 = oVar3;
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xb:
  case 0xf:
    break;
  case 8:
  case 0xc:
    this->field_0x12 = bVar1 & 0xf8;
    this->field_0x12 = bVar1 & 0xf0 | ((rhs->field_0x12 & 8) >> 3 ^ subtract) << 3;
    oVar4 = oVar3;
    break;
  case 10:
    oVar4 = opDivByZero;
    break;
  case 0xe:
    assign(this,rhs);
    this->field_0x12 = this->field_0x12 & 0xf7 | ((rhs->field_0x12 & 8) >> 3 ^ subtract) << 3;
    oVar4 = oVar3;
    break;
  default:
    llvm_unreachable_internal
              ((char *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
               ,0x567);
  }
  return oVar4;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::addOrSubtractSpecials(const IEEEFloat &rhs,
                                                     bool subtract) {
  switch (PackCategoriesIntoKey(category, rhs.category)) {
  default:
    llvm_unreachable(nullptr);

  case PackCategoriesIntoKey(fcNaN, fcZero):
  case PackCategoriesIntoKey(fcNaN, fcNormal):
  case PackCategoriesIntoKey(fcNaN, fcInfinity):
  case PackCategoriesIntoKey(fcNaN, fcNaN):
  case PackCategoriesIntoKey(fcNormal, fcZero):
  case PackCategoriesIntoKey(fcInfinity, fcNormal):
  case PackCategoriesIntoKey(fcInfinity, fcZero):
    return opOK;

  case PackCategoriesIntoKey(fcZero, fcNaN):
  case PackCategoriesIntoKey(fcNormal, fcNaN):
  case PackCategoriesIntoKey(fcInfinity, fcNaN):
    // We need to be sure to flip the sign here for subtraction because we
    // don't have a separate negate operation so -NaN becomes 0 - NaN here.
    sign = rhs.sign ^ subtract;
    category = fcNaN;
    copySignificand(rhs);
    return opOK;

  case PackCategoriesIntoKey(fcNormal, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcInfinity):
    category = fcInfinity;
    sign = rhs.sign ^ subtract;
    return opOK;

  case PackCategoriesIntoKey(fcZero, fcNormal):
    assign(rhs);
    sign = rhs.sign ^ subtract;
    return opOK;

  case PackCategoriesIntoKey(fcZero, fcZero):
    /* Sign depends on rounding mode; handled by caller.  */
    return opOK;

  case PackCategoriesIntoKey(fcInfinity, fcInfinity):
    /* Differently signed infinities can only be validly
       subtracted.  */
    if (((sign ^ rhs.sign)!=0) != subtract) {
      makeNaN();
      return opInvalidOp;
    }

    return opOK;

  case PackCategoriesIntoKey(fcNormal, fcNormal):
    return opDivByZero;
  }
}